

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_tree_state_pop(nk_context *ctx)

{
  int iVar1;
  nk_panel *pnVar2;
  float fVar3;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x47a0,"void nk_tree_state_pop(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x47a1,"void nk_tree_state_pop(struct nk_context *)");
  }
  pnVar2 = ctx->current->layout;
  if (pnVar2 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x47a2,"void nk_tree_state_pop(struct nk_context *)");
  }
  fVar3 = (ctx->style).tab.indent + (ctx->style).window.padding.x;
  pnVar2->at_x = pnVar2->at_x - fVar3;
  (pnVar2->bounds).w = fVar3 + (pnVar2->bounds).w;
  iVar1 = (pnVar2->row).tree_depth;
  if (iVar1 != 0) {
    (pnVar2->row).tree_depth = iVar1 + -1;
    return;
  }
  __assert_fail("layout->row.tree_depth",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x47aa,"void nk_tree_state_pop(struct nk_context *)");
}

Assistant:

NK_API void
nk_tree_state_pop(struct nk_context *ctx)
{
    struct nk_window *win = 0;
    struct nk_panel *layout = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    layout->at_x -= ctx->style.tab.indent + ctx->style.window.padding.x;
    layout->bounds.w += ctx->style.tab.indent + ctx->style.window.padding.x;
    NK_ASSERT(layout->row.tree_depth);
    layout->row.tree_depth--;
}